

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O2

void FAPOBase_ProcessThru
               (FAPOBase *fapo,void *pInputBuffer,float *pOutputBuffer,uint32_t FrameCount,
               uint16_t InputChannelCount,uint16_t OutputChannelCount,uint8_t MixWithOutput)

{
  uint uVar1;
  undefined2 in_register_00000082;
  uint uVar2;
  undefined2 in_register_0000008a;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar3 = CONCAT22(in_register_0000008a,OutputChannelCount);
  uVar2 = CONCAT22(in_register_00000082,InputChannelCount);
  if (MixWithOutput == '\0') {
    uVar4 = 0;
    for (uVar5 = 0; uVar5 != FrameCount; uVar5 = uVar5 + 1) {
      for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
        uVar6 = (ulong)uVar2;
        uVar1 = uVar4;
        while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
          pOutputBuffer[uVar5 * uVar3 + (int)uVar7] =
               *(float *)((long)pInputBuffer + (ulong)uVar1 * 4);
          uVar1 = uVar1 + 1;
        }
      }
      uVar4 = uVar4 + uVar2;
    }
  }
  else {
    uVar4 = 0;
    for (uVar5 = 0; uVar5 != FrameCount; uVar5 = uVar5 + 1) {
      for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
        uVar8 = uVar5 * uVar3 + (int)uVar7;
        uVar6 = (ulong)uVar2;
        uVar1 = uVar4;
        while (bVar9 = uVar6 != 0, uVar6 = uVar6 - 1, bVar9) {
          pOutputBuffer[uVar8] =
               *(float *)((long)pInputBuffer + (ulong)uVar1 * 4) + pOutputBuffer[uVar8];
          uVar1 = uVar1 + 1;
        }
      }
      uVar4 = uVar4 + uVar2;
    }
  }
  return;
}

Assistant:

void FAPOBase_ProcessThru(
	FAPOBase *fapo,
	void* pInputBuffer,
	float *pOutputBuffer,
	uint32_t FrameCount,
	uint16_t InputChannelCount,
	uint16_t OutputChannelCount,
	uint8_t MixWithOutput
) {
	uint32_t i, co, ci;
	float *input = (float*) pInputBuffer;

	if (MixWithOutput)
	{
		/* TODO: SSE */
		for (i = 0; i < FrameCount; i += 1)
		for (co = 0; co < OutputChannelCount; co += 1)
		for (ci = 0; ci < InputChannelCount; ci += 1)
		{
			/* Add, don't overwrite! */
			pOutputBuffer[i * OutputChannelCount + co] +=
				input[i * InputChannelCount + ci];
		}
	}
	else
	{
		/* TODO: SSE */
		for (i = 0; i < FrameCount; i += 1)
		for (co = 0; co < OutputChannelCount; co += 1)
		for (ci = 0; ci < InputChannelCount; ci += 1)
		{
			/* Overwrite, don't add! */
			pOutputBuffer[i * OutputChannelCount + co] =
				input[i * InputChannelCount + ci];
		}
	}
}